

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

FACTRPC * FACT_INTERNAL_GetRPC(FACTAudioEngine *engine,uint32_t code)

{
  long lVar1;
  long lVar2;
  
  if (engine->rpcCount == 0) {
    return (FACTRPC *)0x0;
  }
  lVar2 = 0;
  lVar1 = 0;
  do {
    if (engine->rpcCodes[lVar2] == code) {
      return (FACTRPC *)((long)engine->rpcs - lVar1);
    }
    lVar1 = lVar1 + -0x10;
    lVar2 = lVar2 + 1;
  } while (engine->rpcCount != (uint16_t)lVar2);
  return (FACTRPC *)0x0;
}

Assistant:

FACTRPC* FACT_INTERNAL_GetRPC(
	FACTAudioEngine *engine,
	uint32_t code
) {
	uint16_t i;
	for (i = 0; i < engine->rpcCount; i += 1)
	{
		if (engine->rpcCodes[i] == code)
		{
			return &engine->rpcs[i];
		}
	}

	FAudio_assert(0 && "RPC code not found!");
	return NULL;
}